

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  CURL *pCVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  timeval tVar9;
  timeval older;
  timeval older_00;
  int ec_9;
  CURLMcode ec_8;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  CURLMcode ec_7;
  int local_32c;
  CURLMcode ec_6;
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval interval;
  CURLMcode ec_5;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_178;
  int local_16c;
  undefined1 local_168 [4];
  int handles_added;
  char target_url [256];
  int local_5c;
  int i;
  CURLM *m;
  undefined8 uStack_48;
  int running;
  CURL *curl [4];
  int local_1c;
  int res;
  char *URL_local;
  
  local_1c = 0;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    curl[(long)local_5c + -1] = (CURL *)0x0;
  }
  tVar9 = tutil_tvnow();
  _ec_1 = tVar9.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_178 = tVar9.tv_usec;
  tv_test_start.tv_usec = local_178;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                  ,0x2f,iVar2,uVar3);
    local_1c = iVar2;
  }
  if (local_1c == 0) {
    lVar4 = curl_multi_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                    ,0x31);
      local_1c = 0x7b;
    }
    if (local_1c == 0) {
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        pCVar5 = (CURL *)curl_easy_init();
        curl[(long)local_5c + -1] = pCVar5;
        if (pCVar5 == (CURL *)0x0) {
          curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                        ,0x36);
          local_1c = 0x7c;
        }
        if (local_1c != 0) goto LAB_00102c9e;
        curl_msnprintf(local_168,0x100,"%s%04i",URL,local_5c + 1);
        target_url[0xf7] = '\0';
        iVar2 = curl_easy_setopt(curl[(long)local_5c + -1],0x2712,local_168);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                        ,0x3a,iVar2,uVar3);
          local_1c = iVar2;
        }
        if (local_1c != 0) goto LAB_00102c9e;
        iVar2 = curl_easy_setopt(curl[(long)local_5c + -1],0x29,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                        ,0x3c,iVar2,uVar3);
          local_1c = iVar2;
        }
        if (local_1c != 0) goto LAB_00102c9e;
        iVar2 = curl_easy_setopt(curl[(long)local_5c + -1],0x2a,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                        ,0x3e,iVar2,uVar3);
          local_1c = iVar2;
        }
        if (local_1c != 0) goto LAB_00102c9e;
      }
      local_16c = 1;
      iVar2 = curl_multi_add_handle(lVar4,uStack_48);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                      ,0x44,iVar2,uVar3);
        local_1c = iVar2;
      }
      if (local_1c == 0) {
        iVar2 = curl_multi_setopt(lVar4,3,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                        ,0x46,iVar2,uVar3);
          local_1c = iVar2;
        }
        if (local_1c == 0) {
          curl_mfprintf(_stderr,"Start at URL 0\n");
          do {
            local_32c = -99;
            rd.__fds_bits[0xf] = 1;
            iVar2 = curl_multi_perform(lVar4,(long)&m + 4);
            uVar1 = _stderr;
            if (iVar2 == 0) {
              if (m._4_4_ < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                              ,0x52,m._4_4_);
                local_1c = 0x7a;
              }
            }
            else {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                            ,0x52,iVar2,uVar3);
              local_1c = iVar2;
            }
            if (local_1c != 0) break;
            tVar9 = tutil_tvnow();
            older.tv_usec = tv_test_start.tv_usec;
            older.tv_sec = tv_test_start.tv_sec;
            lVar6 = tutil_tvdiff(tVar9,older);
            if (60000 < lVar6) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                            ,0x54);
              local_1c = 0x7d;
            }
            if (local_1c != 0) break;
            if (m._4_4_ == 0) {
              if (3 < local_16c) break;
              while (local_16c < 4) {
                iVar2 = curl_multi_add_handle(lVar4,curl[(long)local_16c + -1]);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                                ,0x5d,iVar2,uVar3);
                  local_1c = iVar2;
                }
                local_16c = local_16c + 1;
                if (local_1c != 0) goto LAB_00102c9e;
              }
            }
            for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
              wr.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
            }
            for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
              exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
            }
            for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
              (&ec_6 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
              (&ec_6 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
            }
            iVar2 = curl_multi_fdset(lVar4,wr.__fds_bits + 0xf,exc.__fds_bits + 0xf,&ec_6,&local_32c
                                    );
            uVar1 = _stderr;
            if (iVar2 == 0) {
              if (local_32c < -1) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                              ,100,local_32c);
                local_1c = 0x7a;
              }
            }
            else {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                            ,100,iVar2,uVar3);
              local_1c = iVar2;
            }
            if (local_1c != 0) break;
            iVar2 = select_wrapper(local_32c + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                   (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)&ec_6,
                                   (timeval *)(rd.__fds_bits + 0xf));
            if (iVar2 == -1) {
              piVar7 = __errno_location();
              uVar1 = _stderr;
              iVar2 = *piVar7;
              pcVar8 = strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                            ,0x68,iVar2,pcVar8);
              local_1c = 0x79;
            }
            if (local_1c != 0) break;
            tVar9 = tutil_tvnow();
            older_00.tv_usec = tv_test_start.tv_usec;
            older_00.tv_sec = tv_test_start.tv_sec;
            lVar6 = tutil_tvdiff(tVar9,older_00);
            if (60000 < lVar6) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                            ,0x6a);
              local_1c = 0x7d;
            }
          } while (local_1c == 0);
        }
      }
    }
LAB_00102c9e:
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      curl_multi_remove_handle(lVar4,curl[(long)local_5c + -1]);
      curl_easy_cleanup(curl[(long)local_5c + -1]);
    }
    curl_multi_cleanup(lVar4);
    curl_global_cleanup();
    URL_local._4_4_ = local_1c;
  }
  else {
    URL_local._4_4_ = local_1c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  int handles_added = 0;

  for(i = 0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url), "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
  }

  /* Add the first handle to multi. We do this to let libcurl detect
     that the server can do pipelining. The rest of the handles will be
     added later. */
  multi_add_handle(m, curl[handles_added++]);

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(handles_added >= NUM_HANDLES)
        break; /* done */

      /* Add the rest of the handles now that the first handle has completed
         its request. */
      while(handles_added < NUM_HANDLES)
        multi_add_handle(m, curl[handles_added++]);
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}